

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O1

void __thiscall
QPixmapStyle::drawComplexControl
          (QPixmapStyle *this,ComplexControl cc,QStyleOptionComplex *option,QPainter *painter,
          QWidget *widget)

{
  if (cc == CC_ComboBox) {
    drawComboBox(this,option,painter,widget);
    return;
  }
  if (cc != CC_ScrollBar) {
    if (cc == CC_Slider) {
      drawSlider(this,option,painter,widget);
      return;
    }
    QCommonStyle::drawComplexControl(&this->super_QCommonStyle,cc,option,painter,widget);
    return;
  }
  drawScrollBar(this,option,painter,widget);
  return;
}

Assistant:

void QPixmapStyle::drawComplexControl(ComplexControl cc, const QStyleOptionComplex *option,
                                      QPainter *painter, const QWidget *widget) const
{
    switch (cc) {
    case CC_Slider:
        drawSlider(option, painter, widget);
        break;
    case CC_ComboBox:
        drawComboBox(option, painter, widget);
        break;
    case CC_ScrollBar:
        drawScrollBar(option, painter, widget);
        break;
    default:
        QCommonStyle::drawComplexControl(cc, option, painter, widget);
    }
}